

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void Parser::getFirst(Node *node)

{
  Rule *pRVar1;
  long lVar2;
  Rule *t;
  Rule *rule;
  
  if ((node->isEnd == false) &&
     (lVar2 = (long)node->id * 0xd0, *(char *)(mids + 0x22 + lVar2) == '\0')) {
    lVar2 = mids + lVar2;
    *(undefined1 *)(lVar2 + 0x22) = 1;
    pRVar1 = *(Rule **)(lVar2 + 0x30);
    for (rule = *(Rule **)(lVar2 + 0x28); rule != pRVar1; rule = rule + 1) {
      lVar2 = (long)node->id * 0xd0;
      getFirst(rule,(bool *)(mids + lVar2 + 0x20),
               (set<int,_std::less<int>,_std::allocator<int>_> *)(mids + lVar2 + 0x70));
    }
  }
  return;
}

Assistant:

void getFirst(const Node &node){
        if(node.isEnd) return;
        if(mids[node.id].vis) return;
        mids[node.id].vis = true;
        for(auto &t:mids[node.id].rules){
            getFirst(t,mids[node.id].canNone,mids[node.id].first);
        }
    }